

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_METAL_uniform(Context *ctx,RegisterType regtype,int regnum,VariableList *var)

{
  uint uVar1;
  char *pcVar2;
  size_t in_R8;
  ulong uVar3;
  char name [64];
  char varname [64];
  
  get_METAL_uniform_type(ctx,regtype);
  pcVar2 = varname;
  get_METAL_varname_in_buf(ctx,regtype,regnum,pcVar2,in_R8);
  push_output(ctx,&ctx->mainline_top);
  ctx->indent = ctx->indent + 1;
  if (var == (VariableList *)0x0) {
    get_METAL_uniform_array_varname(ctx,regtype,name,(size_t)pcVar2);
    if (regtype == REG_TYPE_CONSTBOOL) {
      uVar3 = (ulong)(uint)ctx->uniform_bool_count;
    }
    else if (regtype == REG_TYPE_CONSTINT) {
      uVar3 = (ulong)(uint)ctx->uniform_int4_count;
    }
    else if (regtype == REG_TYPE_CONST) {
      uVar3 = (ulong)(uint)ctx->uniform_float4_count;
    }
    else {
      uVar3 = 0;
      if (ctx->isfail == 0) {
        __assert_fail("isfail(ctx)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x12a2,
                      "void emit_METAL_uniform(Context *, RegisterType, int, const VariableList *)")
        ;
      }
    }
    pcVar2 = "#define %s %s[%d]";
  }
  else {
    uVar1 = var->index;
    if (var->constant == (ConstantsList *)0x0) {
      if (var->emit_position == -1) {
        __assert_fail("var->emit_position != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x12b8,
                      "void emit_METAL_uniform(Context *, RegisterType, int, const VariableList *)")
        ;
      }
      get_METAL_uniform_array_varname(ctx,regtype,name,(size_t)pcVar2);
      uVar1 = (regnum - uVar1) + var->emit_position;
    }
    else {
      snprintf(name,0x40,"const_array_%d_%d",(ulong)uVar1,(ulong)(uint)var->count);
      uVar1 = regnum - uVar1;
    }
    pcVar2 = "#define %s %s[%d];";
    uVar3 = (ulong)uVar1;
  }
  output_line(ctx,pcVar2,varname,name,uVar3);
  push_output(ctx,&ctx->mainline);
  ctx->indent = ctx->indent + 1;
  output_line(ctx,"#undef %s",varname);
  pop_output(ctx);
  pop_output(ctx);
  return;
}

Assistant:

static void emit_METAL_uniform(Context *ctx, RegisterType regtype, int regnum,
                              const VariableList *var)
{
    // Now that we're pushing all the uniforms as one struct, pack these
    //  down, so if we only use register c439, it'll actually map to
    //  uniforms.uniforms_float4[0]. As we push one big struct, this will
    //  prevent uploading unused data.

    const char *utype = get_METAL_uniform_type(ctx, regtype);
    char varname[64];
    char name[64];
    int index = 0;

    get_METAL_varname_in_buf(ctx, regtype, regnum, varname, sizeof (varname));

    push_output(ctx, &ctx->mainline_top);
    ctx->indent++;

    if (var == NULL)
    {
        get_METAL_uniform_array_varname(ctx, regtype, name, sizeof (name));

        if (regtype == REG_TYPE_CONST)
            index = ctx->uniform_float4_count;
        else if (regtype == REG_TYPE_CONSTINT)
            index = ctx->uniform_int4_count;
        else if (regtype == REG_TYPE_CONSTBOOL)
            index = ctx->uniform_bool_count;
        else  // get_METAL_uniform_array_varname() would have called fail().
            assert(isfail(ctx));

        // !!! FIXME: can cause unused var warnings in Clang...
        //output_line(ctx, "constant %s &%s = %s[%d];", utype, varname, name, index);
        output_line(ctx, "#define %s %s[%d]", varname, name, index);
        push_output(ctx, &ctx->mainline);
        ctx->indent++;
        output_line(ctx, "#undef %s", varname);  // !!! FIXME: gross.
        pop_output(ctx);
    } // if

    else
    {
        const int arraybase = var->index;
        if (var->constant)
        {
            get_METAL_const_array_varname_in_buf(ctx, arraybase, var->count,
                                                name, sizeof (name));
            index = (regnum - arraybase);
        } // if
        else
        {
            assert(var->emit_position != -1);
            get_METAL_uniform_array_varname(ctx, regtype, name, sizeof (name));
            index = (regnum - arraybase) + var->emit_position;
        } // else

        // !!! FIXME: might trigger unused var warnings in Clang.
        //output_line(ctx, "constant %s &%s = %s[%d];", utype, varname, name, index);
        output_line(ctx, "#define %s %s[%d];", varname, name, index);
        push_output(ctx, &ctx->mainline);
        ctx->indent++;
        output_line(ctx, "#undef %s", varname);  // !!! FIXME: gross.
        pop_output(ctx);
    } // else

    pop_output(ctx);
}